

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bool_arg_max.cpp
# Opt level: O0

void bool_arg_max(vec<BoolView> *x,int offset,IntVar *y)

{
  uint uVar1;
  vec<BoolView> *other;
  IntVar *in_RDX;
  undefined4 in_ESI;
  vec<BoolView> *in_RDI;
  uint i;
  vec<BoolView> w;
  BoolView *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  BoolView *in_stack_ffffffffffffff68;
  vec<BoolView> *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff94;
  vec<BoolView> *in_stack_ffffffffffffff98;
  BoolArgMax *in_stack_ffffffffffffffa0;
  IntView<0> in_stack_ffffffffffffffa8;
  uint local_2c;
  vec<BoolView> local_28;
  IntVar *local_18;
  undefined4 local_c;
  vec<BoolView> *local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  vec<BoolView>::vec(&local_28);
  local_2c = 0;
  while( true ) {
    uVar1 = vec<BoolView>::size(local_8);
    if (uVar1 <= local_2c) break;
    vec<BoolView>::operator[](local_8,local_2c);
    in_stack_ffffffffffffff70 = (vec<BoolView> *)&stack0xffffffffffffffb0;
    BoolView::BoolView((BoolView *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
    vec<BoolView>::push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    BoolView::~BoolView((BoolView *)0x1a2118);
    local_2c = local_2c + 1;
  }
  other = (vec<BoolView> *)operator_new(0x38);
  vec<BoolView>::vec<BoolView>(in_stack_ffffffffffffff70,other);
  IntView<0>::IntView((IntView<0> *)&stack0xffffffffffffff90,local_18,1,0);
  BoolArgMax::BoolArgMax
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
             in_stack_ffffffffffffffa8);
  vec<BoolView>::~vec((vec<BoolView> *)CONCAT44(local_c,in_stack_ffffffffffffff60));
  vec<BoolView>::~vec((vec<BoolView> *)CONCAT44(local_c,in_stack_ffffffffffffff60));
  return;
}

Assistant:

void bool_arg_max(vec<BoolView>& x, int offset, IntVar* y) {
	vec<BoolView> w;
	for (unsigned int i = 0; i < x.size(); i++) {
		w.push(BoolView(x[i]));
	}
	new BoolArgMax(w, offset, IntView<>(y));
}